

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::(anonymous_namespace)::GeneratedMessageReflectionSwapTest_BothSet_Test>
::CreateTest(ParameterizedTestFactory<google::protobuf::(anonymous_namespace)::GeneratedMessageReflectionSwapTest_BothSet_Test>
             *this)

{
  Test *this_00;
  
  WithParamInterface<bool>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_018f66c0;
  this_00[1]._vptr_Test =
       (_func_int **)&PTR__GeneratedMessageReflectionSwapTest_BothSet_Test_018f6700;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }